

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O2

void __thiscall PrintStatement::print(PrintStatement *this)

{
  vector<ExprNode_*,_std::allocator<ExprNode_*>_> *__range1;
  pointer ppEVar1;
  vector<ExprNode_*,_std::allocator<ExprNode_*>_> testlist;
  _Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_> local_38;
  
  std::operator<<((ostream *)&std::cout,"print ");
  std::vector<ExprNode_*,_std::allocator<ExprNode_*>_>::vector
            ((vector<ExprNode_*,_std::allocator<ExprNode_*>_> *)&local_38,&this->_testlist->_list);
  for (ppEVar1 = local_38._M_impl.super__Vector_impl_data._M_start;
      ppEVar1 != local_38._M_impl.super__Vector_impl_data._M_finish; ppEVar1 = ppEVar1 + 1) {
    (**(*ppEVar1)->_vptr_ExprNode)();
    std::operator<<((ostream *)&std::cout,", ");
  }
  std::operator<<((ostream *)&std::cout,"\b\b ");
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::_Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>::~_Vector_base(&local_38);
  return;
}

Assistant:

void PrintStatement::print() {
    std::cout << "print ";
    std::vector<ExprNode*>testlist = testList()->getTestlist();
    for(ExprNode* exprNode : testlist){
        exprNode->print();
        std::cout << ", ";
    }
    std::cout << "\b\b ";
    std::cout << std::endl;

}